

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

OutputDirective *
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::apply(OutputDirective *pos,OutputDirective *start,OutputDirective *end)

{
  ExceptionGuard local_28;
  
  local_28.start = pos;
  for (; local_28.pos = pos, start != end; start = start + 1) {
    capnp::compiler::CompilerMain::OutputDirective::OutputDirective(pos,start);
    pos = local_28.pos + 1;
  }
  local_28.start = pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }